

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::GetNode
          (TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
           *this,FName *key)

{
  TValueTraits<MidiDeviceSetting> local_31;
  FName local_30;
  TValueTraits<MidiDeviceSetting> traits;
  Node *n;
  FName *key_local;
  TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_> *this_local;
  
  FName::FName((FName *)&stack0xffffffffffffffd4,key);
  this_local = (TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
                *)FindKey(this,(FName *)&stack0xffffffffffffffd4);
  if ((Node *)this_local == (Node *)0x0) {
    FName::FName(&local_30,key);
    this_local = (TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
                  *)NewKey(this,&local_30);
    TValueTraits<MidiDeviceSetting>::Init(&local_31,&(((Node *)this_local)->Pair).Value);
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}